

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cube.hpp
# Opt level: O3

bool __thiscall Cube::intersect(Cube *this,Ray *ray,Hit *result)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  ulong uVar4;
  undefined4 uVar5;
  undefined1 auVar6 [16];
  uint uVar7;
  uint uVar8;
  float fVar9;
  float fVar10;
  undefined1 auVar11 [16];
  float fVar12;
  float fVar15;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  float fVar16;
  float fVar17;
  bool bVar18;
  float fVar19;
  
  uVar4._0_4_ = (ray->dir).x;
  uVar4._4_4_ = (ray->dir).y;
  uVar3 = (ray->origin).x;
  uVar5 = (ray->origin).y;
  uVar7 = -(uint)(0.0 < (float)(undefined4)uVar4);
  uVar8 = -(uint)(0.0 < (float)uVar4._4_4_);
  auVar13._0_4_ = (float)(~uVar7 & 0x3f000000 | uVar7 & 0xbf000000) - (float)uVar3;
  auVar13._4_4_ = (float)(~uVar8 & 0x3f000000 | uVar8 & 0xbf000000) - (float)uVar5;
  auVar13._8_8_ = 0;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uVar4;
  auVar14 = divps(auVar13,auVar14);
  fVar12 = auVar14._0_4_;
  fVar15 = auVar14._4_4_;
  fVar10 = 1.0;
  fVar9 = (float)(~-(uint)(fVar12 < fVar15) & 0x3f800000);
  fVar16 = 0.0;
  if (fVar15 <= fVar12) {
    fVar10 = 0.0;
    fVar15 = fVar12;
  }
  auVar11._0_4_ = (float)(uVar7 & 0x3f000000 | ~uVar7 & 0xbf000000) - (float)uVar3;
  auVar11._4_4_ = (float)(uVar8 & 0x3f000000 | ~uVar8 & 0xbf000000) - (float)uVar5;
  auVar11._8_8_ = 0;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar4;
  auVar14 = divps(auVar11,auVar6);
  fVar12 = auVar14._4_4_;
  if (auVar14._0_4_ <= auVar14._4_4_) {
    fVar12 = auVar14._0_4_;
  }
  fVar1 = (ray->dir).z;
  fVar2 = (ray->origin).z;
  if (fVar1 <= 0.0) {
    fVar17 = 0.5 - fVar2;
    fVar19 = -0.5;
  }
  else {
    fVar17 = -0.5 - fVar2;
    fVar19 = 0.5;
  }
  if (fVar15 < fVar17 / fVar1) {
    fVar16 = 1.0;
    fVar9 = 0.0;
    fVar10 = 0.0;
    fVar15 = fVar17 / fVar1;
  }
  fVar17 = (fVar19 - fVar2) / fVar1;
  if (fVar12 <= fVar17) {
    fVar17 = fVar12;
  }
  bVar18 = fVar15 <= fVar17 && 0.0 < fVar15;
  if (bVar18) {
    result->hit = true;
    (result->p).x = (float)(undefined4)uVar4 * fVar15 + (float)uVar3;
    (result->p).y = (float)uVar4._4_4_ * fVar15 + (float)uVar5;
    (result->p).z = fVar1 * fVar15 + fVar2;
    (result->Ns).x = fVar9;
    (result->Ns).y = fVar10;
    (result->Ns).z = fVar16;
    (result->Ng).x = fVar9;
    (result->Ng).y = fVar10;
    (result->Ng).z = fVar16;
    (result->uv).x = 0.0;
    (result->uv).y = 0.0;
    (result->dpdu).x = 0.0;
    (result->dpdu).y = 0.0;
    *(undefined8 *)&(result->dpdu).z = 0;
    (result->dpdv).y = 0.0;
    (result->dpdv).z = 0.0;
  }
  return bVar18;
}

Assistant:

bool intersect(const Ray& ray, Hit* result) const
	{
		float tmin, tmax;
		vec3f resN = vec3f(1,0,0);

		if (ray.dir.x > 0) {
			tmin = (x1 - ray.origin.x) / ray.dir.x;
			tmax = (x2 - ray.origin.x) / ray.dir.x;
		}
		else {
			tmin = (x2 - ray.origin.x) / ray.dir.x;
			tmax = (x1 - ray.origin.x) / ray.dir.x;
		}
		if (ray.dir.y > 0) {
			float tminy = (y1 - ray.origin.y) / ray.dir.y;
			if (tminy > tmin) {
				tmin = tminy;
				resN = vec3f(0,1,0);
			}
			tmax = std::min(tmax, (y2 - ray.origin.y) / ray.dir.y);
		}
		else {
			float tminy = (y2 - ray.origin.y) / ray.dir.y;
			if (tminy > tmin) {
				tmin = tminy;
				resN = vec3f(0,1,0);
			}
			tmax = std::min(tmax, (y1 - ray.origin.y) / ray.dir.y);
		}
		if (ray.dir.z > 0) {
			float tminz = (z1 - ray.origin.z) / ray.dir.z;
			if (tminz > tmin) {
				tmin = tminz;
				resN = vec3f(0,0,1);
			}
			tmax = std::min(tmax, (z2 - ray.origin.z) / ray.dir.z);
		}
		else {
			float tminz = (z2 - ray.origin.z) / ray.dir.z;
			if (tminz > tmin) {
				tmin = tminz;
				resN = vec3f(0,0,1);
			}
			tmax = std::min(tmax, (z1 - ray.origin.z) / ray.dir.z);
		}
		if (0<tmin && tmin <= tmax)
		{
			*result = Hit(ray.atParam(tmin), resN, resN, 0); // TODO Cube texture
			return true;
		}
		return false;
	}